

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_matrix_sparse.cpp
# Opt level: O3

void __thiscall test_matrix_sparse_erase_Test::TestBody(test_matrix_sparse_erase_Test *this)

{
  initializer_list<double> value;
  undefined8 uVar1;
  bool bVar2;
  char cVar3;
  int iVar4;
  Scalar *pSVar5;
  size_type sVar6;
  StringLike<const_char_*> *regex;
  StringLike<const_char_*> *regex_00;
  StringLike<const_char_*> *regex_01;
  undefined1 auVar7 [8];
  char *pcVar8;
  char *pcVar9;
  pointer *__ptr;
  initializer_list<unsigned_long> non_zero;
  initializer_list<unsigned_long> index;
  DeathTest *gtest_dt;
  Matrix_Sparse matrix;
  iterator_element iter;
  undefined1 local_158 [16];
  undefined1 local_148 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_140;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_138;
  undefined1 local_128 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbStack_120;
  pointer local_118;
  AssertHelper local_108;
  pointer local_100;
  Matrix_Sparse local_f8;
  iterator_element local_a8;
  iterator local_80;
  undefined8 uStack_78;
  MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_70;
  MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_58;
  MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_40;
  
  local_a8.column_index = (size_type *)0x0;
  local_a8.value = (pointer)0x2;
  local_a8.row_index = 3;
  local_148 = (undefined1  [8])0x1;
  _Stack_140._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_138._M_allocated_capacity = 0;
  local_80 = (iterator)local_128;
  local_128 = (undefined1  [8])0x3ff0000000000000;
  pbStack_120 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                0x4000000000000000;
  local_118 = (pointer)&DAT_4008000000000000;
  uStack_78 = 3;
  pcVar9 = (char *)0x2;
  value._M_len = 3;
  value._M_array = local_80;
  non_zero._M_len = 3;
  non_zero._M_array = (iterator)&local_a8;
  index._M_len = 3;
  index._M_array = (iterator)local_148;
  Disa::Matrix_Sparse::Matrix_Sparse(&local_f8,non_zero,index,value,2);
  local_128 = (undefined1  [8])0x0;
  local_158._0_8_ = (AssertHelperData *)0x1;
  Disa::Matrix_Sparse::find
            ((iterator_element *)local_148,&local_f8,(size_t *)local_128,(size_t *)local_158);
  Disa::Matrix_Sparse::erase
            (&local_a8,&local_f8,(Iterator_Matrix_Sparse_Element<Disa::Matrix_Sparse> *)local_148);
  local_128 = (undefined1  [8])
              (_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
               )0x0;
  if (local_f8.row_non_zero.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      local_f8.row_non_zero.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
      _M_impl.super__Vector_impl_data._M_start) {
    local_128 = (undefined1  [8])
                (((long)local_f8.row_non_zero.
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                  (long)local_f8.row_non_zero.
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data._M_start >> 3) + -1);
  }
  local_158._0_4_ = 2;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)local_148,"matrix.size_row()","2",(unsigned_long *)local_128,
             (int *)local_158);
  if (local_148[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_128);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)_Stack_140._M_pi ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar8 = "";
    }
    else {
      pcVar8 = ((_Alloc_hider *)&(_Stack_140._M_pi)->_vptr__Sp_counted_base)->_M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_158,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x14b,pcVar8);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_158,(Message *)local_128);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_158);
    if (local_128 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_128 + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)_Stack_140._M_pi !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&_Stack_140,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 _Stack_140._M_pi);
  }
  local_128 = (undefined1  [8])local_f8.column_size;
  local_158._0_4_ = 2;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)local_148,"matrix.size_column()","2",(unsigned_long *)local_128,
             (int *)local_158);
  if (local_148[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_128);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)_Stack_140._M_pi ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar8 = "";
    }
    else {
      pcVar8 = ((_Alloc_hider *)&(_Stack_140._M_pi)->_vptr__Sp_counted_base)->_M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_158,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x14c,pcVar8);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_158,(Message *)local_128);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_158);
    if (local_128 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_128 + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)_Stack_140._M_pi !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&_Stack_140,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 _Stack_140._M_pi);
  }
  local_128 = (undefined1  [8])
              ((long)local_f8.column_index.
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)local_f8.column_index.
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_start >> 3);
  local_158._0_4_ = 2;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)local_148,"matrix.size_non_zero()","2",(unsigned_long *)local_128,
             (int *)local_158);
  if (local_148[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_128);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)_Stack_140._M_pi ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar8 = "";
    }
    else {
      pcVar8 = ((_Alloc_hider *)&(_Stack_140._M_pi)->_vptr__Sp_counted_base)->_M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_158,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x14d,pcVar8);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_158,(Message *)local_128);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_158);
    if (local_128 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_128 + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)_Stack_140._M_pi !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&_Stack_140,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 _Stack_140._M_pi);
  }
  local_108.data_ = (AssertHelperData *)0x0;
  Disa::Matrix_Sparse::operator[]((Matrix_Sparse *)local_158,(size_t *)&local_f8);
  Disa::Matrix_Sparse_Row<Disa::Matrix_Sparse>::end
            ((iterator *)local_148,(Matrix_Sparse_Row<Disa::Matrix_Sparse> *)local_158);
  if (((local_a8.matrix == (matrix_type *)local_138._8_8_) &&
      (local_a8.row_index == local_138._M_allocated_capacity)) &&
     ((undefined1  [8])local_a8.column_index == local_148)) {
    local_128[0] = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8.value ==
                   _Stack_140._M_pi;
    pbStack_120 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8.value != _Stack_140._M_pi)
    goto LAB_0011997e;
  }
  else {
    local_128 = (undefined1  [8])((ulong)(uint7)local_128._1_7_ << 8);
LAB_0011997e:
    pbStack_120 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    testing::Message::Message((Message *)local_158);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_148,(internal *)local_128,
               (AssertionResult *)"iter == matrix[0].end()","false","true",pcVar9);
    testing::internal::AssertHelper::AssertHelper
              (&local_108,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x14e,(char *)local_148);
    testing::internal::AssertHelper::operator=(&local_108,(Message *)local_158);
    testing::internal::AssertHelper::~AssertHelper(&local_108);
    if (local_148 != (undefined1  [8])&local_138) {
      operator_delete((void *)local_148,local_138._M_allocated_capacity + 1);
    }
    if ((AssertHelperData *)local_158._0_8_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_158._0_8_ + 8))();
    }
    if (pbStack_120 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&pbStack_120,pbStack_120);
    }
  }
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_148,"*iter","3.0",(double)((_Alloc_hider *)local_a8.value)->_M_p,3.0)
  ;
  if (local_148[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_128);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)_Stack_140._M_pi ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar9 = "";
    }
    else {
      pcVar9 = ((_Alloc_hider *)&(_Stack_140._M_pi)->_vptr__Sp_counted_base)->_M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_158,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x14f,pcVar9);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_158,(Message *)local_128);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_158);
    if (local_128 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_128 + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)_Stack_140._M_pi !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&_Stack_140,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 _Stack_140._M_pi);
  }
  local_158._0_8_ = (AssertHelperData *)0x0;
  Disa::Matrix_Sparse::operator[]((Matrix_Sparse *)local_128,(size_t *)&local_f8);
  local_108.data_ = (AssertHelperData *)0x0;
  pSVar5 = Disa::Matrix_Sparse_Row<Disa::Matrix_Sparse>::operator[]<Disa::Matrix_Sparse,_true>
                     ((Matrix_Sparse_Row<Disa::Matrix_Sparse> *)local_128,(size_t *)&local_108);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_148,"matrix[0][0]","2.0",*pSVar5,2.0);
  if (local_148[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_128);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)_Stack_140._M_pi ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar9 = "";
    }
    else {
      pcVar9 = ((_Alloc_hider *)&(_Stack_140._M_pi)->_vptr__Sp_counted_base)->_M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_158,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x150,pcVar9);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_158,(Message *)local_128);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_158);
    if (local_128 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_128 + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)_Stack_140._M_pi !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&_Stack_140,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 _Stack_140._M_pi);
  }
  local_158._0_8_ =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        *)0x1;
  Disa::Matrix_Sparse::operator[]((Matrix_Sparse *)local_128,(size_t *)&local_f8);
  local_108.data_ = (AssertHelperData *)0x0;
  pSVar5 = Disa::Matrix_Sparse_Row<Disa::Matrix_Sparse>::operator[]<Disa::Matrix_Sparse,_true>
                     ((Matrix_Sparse_Row<Disa::Matrix_Sparse> *)local_128,(size_t *)&local_108);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_148,"matrix[1][0]","3.0",*pSVar5,3.0);
  if (local_148[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_128);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)_Stack_140._M_pi ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar9 = "";
    }
    else {
      pcVar9 = ((_Alloc_hider *)&(_Stack_140._M_pi)->_vptr__Sp_counted_base)->_M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_158,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x151,pcVar9);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_158,(Message *)local_128);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_158);
    if (local_128 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_128 + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)_Stack_140._M_pi !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&_Stack_140,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 _Stack_140._M_pi);
  }
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    local_128 = (undefined1  [8])0x168590;
    testing::ContainsRegex<char_const*>
              ((PolymorphicMatcher<testing::internal::MatchesRegexMatcher> *)local_148,
               (testing *)local_128,regex);
    testing::PolymorphicMatcher::operator_cast_to_Matcher
              ((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)&local_40,(PolymorphicMatcher *)local_148);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)_Stack_140._M_pi !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_140._M_pi);
    }
    bVar2 = testing::internal::DeathTest::Create
                      ("matrix.erase(matrix.find(3, 0))",
                       (Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                        *)&local_40,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
                       ,0x154,(DeathTest **)local_158);
    testing::internal::
    MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~MatcherBase(&local_40);
    auVar7 = (undefined1  [8])local_158._0_8_;
    if (!bVar2) goto LAB_00119de7;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_158._0_8_ !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      iVar4 = (**(code **)(*(size_type *)local_158._0_8_ + 0x10))(local_158._0_8_);
      uVar1 = local_158._0_8_;
      if (iVar4 == 0) {
        iVar4 = (**(code **)(*(size_type *)local_158._0_8_ + 0x18))(local_158._0_8_);
        bVar2 = testing::internal::ExitedUnsuccessfully(iVar4);
        cVar3 = (**(code **)(*(size_type *)uVar1 + 0x20))(uVar1,bVar2);
        if (cVar3 == '\0') {
          (**(code **)(*(size_type *)auVar7 + 8))(auVar7);
          goto LAB_00119de7;
        }
      }
      else if (iVar4 == 1) {
        bVar2 = testing::internal::AlwaysTrue();
        if (bVar2) {
          local_108.data_ = (AssertHelperData *)0x3;
          local_100 = (pointer)0x0;
          Disa::Matrix_Sparse::find
                    ((iterator_element *)local_148,&local_f8,(size_t *)&local_108,
                     (size_t *)&local_100);
          Disa::Matrix_Sparse::erase
                    ((iterator_element *)local_128,&local_f8,
                     (Iterator_Matrix_Sparse_Element<Disa::Matrix_Sparse> *)local_148);
        }
        (**(code **)(*(size_type *)local_158._0_8_ + 0x28))(local_158._0_8_,2);
        (**(code **)(*(size_type *)uVar1 + 0x28))(uVar1,0);
      }
      sVar6 = *(size_type *)auVar7;
      goto LAB_00119e3a;
    }
  }
  else {
LAB_00119de7:
    testing::Message::Message((Message *)local_148);
    pcVar9 = testing::internal::DeathTest::LastMessage();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_128,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x154,pcVar9);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_128,(Message *)local_148);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_128);
    if (local_148 != (undefined1  [8])0x0) {
      sVar6 = *(size_type *)local_148;
      auVar7 = local_148;
LAB_00119e3a:
      (**(code **)(sVar6 + 8))(auVar7);
    }
  }
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    local_128 = (undefined1  [8])0x168590;
    testing::ContainsRegex<char_const*>
              ((PolymorphicMatcher<testing::internal::MatchesRegexMatcher> *)local_148,
               (testing *)local_128,regex_00);
    testing::PolymorphicMatcher::operator_cast_to_Matcher
              ((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)&local_58,(PolymorphicMatcher *)local_148);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)_Stack_140._M_pi !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_140._M_pi);
    }
    bVar2 = testing::internal::DeathTest::Create
                      ("matrix.erase(matrix.find(0, 2))",
                       (Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                        *)&local_58,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
                       ,0x155,(DeathTest **)local_158);
    testing::internal::
    MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~MatcherBase(&local_58);
    auVar7 = (undefined1  [8])local_158._0_8_;
    if (!bVar2) goto LAB_00119f80;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_158._0_8_ !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      iVar4 = (**(code **)(*(size_type *)local_158._0_8_ + 0x10))(local_158._0_8_);
      uVar1 = local_158._0_8_;
      if (iVar4 == 0) {
        iVar4 = (**(code **)(*(size_type *)local_158._0_8_ + 0x18))(local_158._0_8_);
        bVar2 = testing::internal::ExitedUnsuccessfully(iVar4);
        cVar3 = (**(code **)(*(size_type *)uVar1 + 0x20))(uVar1,bVar2);
        if (cVar3 == '\0') {
          (**(code **)(*(size_type *)auVar7 + 8))(auVar7);
          goto LAB_00119f80;
        }
      }
      else if (iVar4 == 1) {
        bVar2 = testing::internal::AlwaysTrue();
        if (bVar2) {
          local_108.data_ = (AssertHelperData *)0x0;
          local_100 = (pointer)0x2;
          Disa::Matrix_Sparse::find
                    ((iterator_element *)local_148,&local_f8,(size_t *)&local_108,
                     (size_t *)&local_100);
          Disa::Matrix_Sparse::erase
                    ((iterator_element *)local_128,&local_f8,
                     (Iterator_Matrix_Sparse_Element<Disa::Matrix_Sparse> *)local_148);
        }
        (**(code **)(*(size_type *)local_158._0_8_ + 0x28))(local_158._0_8_,2);
        (**(code **)(*(size_type *)uVar1 + 0x28))(uVar1,0);
      }
      sVar6 = *(size_type *)auVar7;
      goto LAB_00119fd3;
    }
  }
  else {
LAB_00119f80:
    testing::Message::Message((Message *)local_148);
    pcVar9 = testing::internal::DeathTest::LastMessage();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_128,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x155,pcVar9);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_128,(Message *)local_148);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_128);
    if (local_148 != (undefined1  [8])0x0) {
      sVar6 = *(size_type *)local_148;
      auVar7 = local_148;
LAB_00119fd3:
      (**(code **)(sVar6 + 8))(auVar7);
    }
  }
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    local_128 = (undefined1  [8])0x168590;
    testing::ContainsRegex<char_const*>
              ((PolymorphicMatcher<testing::internal::MatchesRegexMatcher> *)local_148,
               (testing *)local_128,regex_01);
    testing::PolymorphicMatcher::operator_cast_to_Matcher
              ((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)&local_70,(PolymorphicMatcher *)local_148);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)_Stack_140._M_pi !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_140._M_pi);
    }
    bVar2 = testing::internal::DeathTest::Create
                      ("matrix.erase(matrix.find(1, 1))",
                       (Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                        *)&local_70,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
                       ,0x156,(DeathTest **)local_158);
    testing::internal::
    MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~MatcherBase(&local_70);
    auVar7 = (undefined1  [8])local_158._0_8_;
    if (!bVar2) goto LAB_0011a116;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_158._0_8_ ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) goto LAB_0011a16c;
    iVar4 = (**(code **)(*(size_type *)local_158._0_8_ + 0x10))(local_158._0_8_);
    uVar1 = local_158._0_8_;
    if (iVar4 == 0) {
      iVar4 = (**(code **)(*(size_type *)local_158._0_8_ + 0x18))(local_158._0_8_);
      bVar2 = testing::internal::ExitedUnsuccessfully(iVar4);
      cVar3 = (**(code **)(*(size_type *)uVar1 + 0x20))(uVar1,bVar2);
      if (cVar3 == '\0') {
        (**(code **)(*(size_type *)auVar7 + 8))(auVar7);
        goto LAB_0011a116;
      }
    }
    else if (iVar4 == 1) {
      bVar2 = testing::internal::AlwaysTrue();
      if (bVar2) {
        local_108.data_ = (AssertHelperData *)0x1;
        local_100 = (pointer)0x1;
        Disa::Matrix_Sparse::find
                  ((iterator_element *)local_148,&local_f8,(size_t *)&local_108,(size_t *)&local_100
                  );
        Disa::Matrix_Sparse::erase
                  ((iterator_element *)local_128,&local_f8,
                   (Iterator_Matrix_Sparse_Element<Disa::Matrix_Sparse> *)local_148);
      }
      (**(code **)(*(size_type *)local_158._0_8_ + 0x28))(local_158._0_8_,2);
      (**(code **)(*(size_type *)uVar1 + 0x28))(uVar1,0);
    }
    sVar6 = *(size_type *)auVar7;
  }
  else {
LAB_0011a116:
    testing::Message::Message((Message *)local_148);
    pcVar9 = testing::internal::DeathTest::LastMessage();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_128,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x156,pcVar9);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_128,(Message *)local_148);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_128);
    if (local_148 == (undefined1  [8])0x0) goto LAB_0011a16c;
    sVar6 = *(size_type *)local_148;
    auVar7 = local_148;
  }
  (**(code **)(sVar6 + 8))(auVar7);
LAB_0011a16c:
  Disa::Matrix_Sparse::~Matrix_Sparse(&local_f8);
  return;
}

Assistant:

TEST(test_matrix_sparse, erase) {
  Matrix_Sparse matrix({0, 2, 3}, {1, 0, 0}, {1.0, 2.0, 3.0}, 2);
  auto iter = matrix.erase(matrix.find(0, 1));
  EXPECT_EQ(matrix.size_row(), 2);
  EXPECT_EQ(matrix.size_column(), 2);
  EXPECT_EQ(matrix.size_non_zero(), 2);
  EXPECT_TRUE(iter == matrix[0].end());  // should point to end
  EXPECT_DOUBLE_EQ(*iter, 3.0);          // end should be the next row over.
  EXPECT_DOUBLE_EQ(matrix[0][0], 2.0);
  EXPECT_DOUBLE_EQ(matrix[1][0], 3.0);

  // Check debug undefined behaviour
  EXPECT_DEATH(matrix.erase(matrix.find(3, 0)), "./*");
  EXPECT_DEATH(matrix.erase(matrix.find(0, 2)), "./*");
  EXPECT_DEATH(matrix.erase(matrix.find(1, 1)), "./*");
}